

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

void __thiscall Lodtalk::AST::MessageSendNode::~MessageSendNode(MessageSendNode *this)

{
  pointer ppNVar1;
  pointer ppMVar2;
  pointer pcVar3;
  Node **arg;
  pointer ppNVar4;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MessageSendNode_00162f00;
  if (this->receiver != (Node *)0x0) {
    (*this->receiver->_vptr_Node[1])();
  }
  ppNVar1 = (this->arguments).
            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar4 = (this->arguments).
                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1
      ) {
    if (*ppNVar4 != (Node *)0x0) {
      (*(*ppNVar4)->_vptr_Node[1])();
    }
  }
  ppMVar2 = (this->chainedMessages).
            super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar2 != (pointer)0x0) {
    operator_delete(ppMVar2);
  }
  ppNVar4 = (this->arguments).
            super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar4 != (pointer)0x0) {
    operator_delete(ppNVar4);
  }
  pcVar3 = (this->selector)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->selector).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

MessageSendNode::~MessageSendNode()
{
	delete receiver;
	for(auto &arg : arguments)
		delete arg;
}